

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int execute_filter(archive_read *a,rar_filter *filter,rar_virtual_machine *vm,size_t pos)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  char cVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  uint8_t *puVar17;
  uint8_t uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  char cVar22;
  short sVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  char cVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int local_88 [4];
  int local_78 [7];
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  byte local_48;
  undefined3 uStack_47;
  uint8_t *local_38;
  
  uVar4 = filter->prog->fingerprint;
  if ((long)uVar4 < 0x393cd7e57e) {
    if (uVar4 == 0x1d0e06077d) {
      uVar2 = filter->initialregisters[4];
      if ((ulong)uVar2 < 0x1e001) {
        uVar3 = filter->initialregisters[0];
        if (uVar3 != 0) {
          puVar11 = vm->memory;
          uVar27 = 0;
          do {
            if (uVar27 < uVar2) {
              uVar18 = '\0';
              uVar26 = uVar27;
              do {
                uVar18 = uVar18 - *puVar11;
                puVar11 = puVar11 + 1;
                vm->memory[(ulong)uVar26 + (ulong)uVar2] = uVar18;
                uVar26 = uVar26 + uVar3;
              } while (uVar26 < uVar2);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar3);
        }
        filter->filteredblockaddress = uVar2;
        filter->filteredblocklength = uVar2;
        return 1;
      }
      return 0;
    }
    if (uVar4 != 0x35ad576887) {
LAB_001537fa:
      archive_set_error(&a->archive,0x54,"No support for RAR VM program filter");
      return 0;
    }
    iVar6 = 0;
  }
  else {
    if (uVar4 != 0x393cd7e57e) {
      if (uVar4 == 0x951c2c5dc8) {
        uVar2 = filter->initialregisters[4];
        if (uVar2 < filter->initialregisters[0] || 0x1e000 < uVar2) {
          return 0;
        }
        uVar27 = filter->initialregisters[1];
        uVar8 = (ulong)filter->initialregisters[0];
        uVar21 = (ulong)uVar2;
        puVar11 = vm->memory;
        puVar17 = vm->memory + uVar21;
        uVar12 = 0;
        do {
          if (uVar12 < uVar21) {
            bVar14 = 0;
            uVar28 = uVar12;
            do {
              if (puVar17 <= (undefined1 *)((long)vm + uVar28 + (uVar21 - uVar8) + 0x20)) {
                bVar1 = puVar17[uVar28 - uVar8];
                uVar10 = (uint)puVar17[uVar28 + (3 - uVar8)] - (uint)bVar1;
                uVar26 = -uVar10;
                if (0 < (int)uVar10) {
                  uVar26 = uVar10;
                }
                uVar15 = (uint)bVar14 - (uint)bVar1;
                uVar24 = -uVar15;
                if (0 < (int)uVar15) {
                  uVar24 = uVar15;
                }
                uVar15 = uVar15 + uVar10;
                uVar10 = -uVar15;
                if (0 < (int)uVar15) {
                  uVar10 = uVar15;
                }
                if ((((uVar24 & 0xff) < (uVar26 & 0xff)) || (uVar10 < (uVar26 & 0xff))) &&
                   (bVar14 = bVar1, (uVar24 & 0xff) <= uVar10)) {
                  bVar14 = puVar17[uVar28 + (3 - uVar8)];
                }
              }
              bVar14 = bVar14 - *puVar11;
              puVar11 = puVar11 + 1;
              puVar17[uVar28] = bVar14;
              uVar28 = uVar28 + 3;
            } while (uVar28 < uVar21);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 3);
        for (; uVar27 < uVar2 - 2; uVar27 = uVar27 + 3) {
          puVar17[uVar27] = puVar17[uVar27] + puVar17[uVar27 + 1];
          puVar17[uVar27 + 2] = puVar17[uVar27 + 2] + puVar17[uVar27 + 1];
        }
        filter->filteredblockaddress = uVar2;
        filter->filteredblocklength = uVar2;
      }
      else {
        if (uVar4 != 0xd8bc85e701) goto LAB_001537fa;
        uVar2 = filter->initialregisters[4];
        if (0x1e000 < (ulong)uVar2) {
          return 0;
        }
        uVar3 = filter->initialregisters[0];
        if (uVar3 != 0) {
          local_38 = vm->memory + uVar2;
          puVar11 = vm->memory;
          uVar27 = 0;
          do {
            local_58 = 0;
            uStack_54 = 0;
            uStack_50 = 0;
            uStack_5c = 0;
            if (uVar27 < uVar2) {
              local_78[0] = 0;
              local_78[1] = 0;
              local_78[2] = 0;
              local_78[3] = 0;
              local_78[6] = 0;
              local_78[5] = 0;
              local_78[4] = 0;
              uStack_4c = 0;
              cVar29 = '\0';
              cVar13 = '\0';
              cVar22 = '\0';
              uVar24 = 0;
              cVar5 = '\0';
              uVar26 = uVar27;
              iVar6 = 0;
              uVar10 = 0;
              do {
                iVar9 = (int)(char)*puVar11;
                sVar23 = (short)uVar24;
                iVar25 = (int)cVar22;
                uVar15 = uVar24 & 0xffff;
                uVar24 = iVar25 - iVar6;
                local_48 = (char)((int)cVar29 * uVar15 + uVar10 * 8 + (int)cVar13 * uVar24 +
                                  cVar5 * iVar25 >> 3) - *puVar11;
                uVar19 = iVar9 * 8;
                uVar15 = iVar25 + iVar9 * 8;
                uVar16 = uVar19 - (int)(short)uVar24;
                iVar6 = (int)(short)uVar24 + iVar9 * 8;
                iVar20 = -iVar6;
                if (0 < iVar6) {
                  iVar20 = iVar6;
                }
                local_78[4] = iVar20 + local_78[4];
                iVar20 = uVar19 - (int)sVar23;
                iVar6 = -iVar20;
                if (0 < iVar20) {
                  iVar6 = iVar20;
                }
                local_78[5] = iVar6 + local_78[5];
                iVar6 = (int)sVar23 + iVar9 * 8;
                iVar20 = -iVar6;
                if (0 < iVar6) {
                  iVar20 = iVar6;
                }
                uVar30 = (int)(uVar19 - iVar25) >> 0x1f;
                uVar31 = (int)uVar15 >> 0x1f;
                uVar32 = (int)uVar16 >> 0x1f;
                local_78[0] = ((uVar19 ^ (int)uVar19 >> 0x1f) - ((int)uVar19 >> 0x1f)) + local_78[0]
                ;
                local_78[1] = ((uVar19 - iVar25 ^ uVar30) - uVar30) + local_78[1];
                local_78[2] = ((uVar15 ^ uVar31) - uVar31) + local_78[2];
                local_78[3] = ((uVar16 ^ uVar32) - uVar32) + local_78[3];
                local_78[6] = iVar20 + local_78[6];
                cVar22 = local_48 - (char)uVar10;
                uStack_47 = 0;
                (vm->memory + uVar2)[uVar26] = local_48;
                uVar10 = uStack_4c & 0x1f;
                uStack_4c = uStack_4c + 1;
                if (uVar10 == 0) {
                  lVar7 = 5;
                  uVar8 = 0;
                  do {
                    if (local_88[lVar7] < local_78[uVar8]) {
                      uVar8 = (ulong)((int)lVar7 - 4U & 0xff);
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 0xb);
                  local_58 = 0;
                  uStack_54 = 0;
                  uStack_50 = 0;
                  uStack_5c = 0;
                  local_78[0] = 0;
                  local_78[1] = 0;
                  local_78[2] = 0;
                  local_78[3] = 0;
                  local_78[6] = 0;
                  switch((int)uVar8) {
                  case 1:
                    if (-0x11 < cVar5) {
                      cVar5 = cVar5 + -1;
                    }
                    break;
                  case 2:
                    if (cVar5 < '\x10') {
                      cVar5 = cVar5 + '\x01';
                    }
                    break;
                  case 3:
                    if (-0x11 < cVar13) {
                      cVar13 = cVar13 + -1;
                    }
                    break;
                  case 4:
                    if (cVar13 < '\x10') {
                      cVar13 = cVar13 + '\x01';
                    }
                    break;
                  case 5:
                    if (-0x11 < cVar29) {
                      cVar29 = cVar29 + -1;
                    }
                    break;
                  case 6:
                    if (cVar29 < '\x10') {
                      cVar29 = cVar29 + '\x01';
                    }
                  }
                  local_78[5] = 0;
                  local_78[4] = 0;
                }
                puVar11 = puVar11 + 1;
                uVar26 = uVar26 + uVar3;
                iVar6 = iVar25;
                uVar10 = (uint)local_48;
              } while (uVar26 < uVar2);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar3);
        }
        filter->filteredblockaddress = uVar2;
        filter->filteredblocklength = uVar2;
      }
      return 1;
    }
    iVar6 = 1;
  }
  iVar6 = execute_filter_e8(filter,vm,pos,iVar6);
  return iVar6;
}

Assistant:

static int
execute_filter(struct archive_read *a, struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos)
{
  if (filter->prog->fingerprint == 0x1D0E06077D)
    return execute_filter_delta(filter, vm);
  if (filter->prog->fingerprint == 0x35AD576887)
    return execute_filter_e8(filter, vm, pos, 0);
  if (filter->prog->fingerprint == 0x393CD7E57E)
    return execute_filter_e8(filter, vm, pos, 1);
  if (filter->prog->fingerprint == 0x951C2C5DC8)
    return execute_filter_rgb(filter, vm);
  if (filter->prog->fingerprint == 0xD8BC85E701)
    return execute_filter_audio(filter, vm);

  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT, "No support for RAR VM program filter");
  return 0;
}